

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O1

int Abc_ZddDotMinProduct6(Abc_ZddMan *p,int a,int b)

{
  Abc_ZddObj *pAVar1;
  Abc_ZddObj *pAVar2;
  Abc_ZddEnt *pAVar3;
  int iVar4;
  int b_00;
  uint uVar5;
  uint a_00;
  uint a_01;
  uint uVar6;
  int local_40;
  
  do {
    a_00 = a;
    a = b;
    if (a_00 == 0) {
      return 0;
    }
    if (a == 0) {
      return 0;
    }
    if (a_00 == 1) {
      return a;
    }
    if (a == 1) {
      return a_00;
    }
    b = a_00;
  } while (a < (int)a_00);
  pAVar3 = p->pCache;
  uVar6 = a_00 * 0xc00005 + a * 0x40f1f9 + 0x7c737b;
  uVar5 = p->nCacheMask & uVar6;
  p->nCacheLookups = p->nCacheLookups + 1;
  iVar4 = -1;
  if (((pAVar3[uVar5].Arg0 == a_00) && (pAVar3[uVar5].Arg1 == a)) && (pAVar3[uVar5].Arg2 == 0xb)) {
    iVar4 = pAVar3[uVar5].Res;
  }
  if (-1 < iVar4) {
    return iVar4;
  }
  pAVar1 = p->pObjs + (int)a_00;
  pAVar2 = p->pObjs + a;
  if ((*(uint *)pAVar1 & 0x7fffffff) < (*(uint *)pAVar2 & 0x7fffffff)) {
    local_40 = Abc_ZddDotMinProduct6(p,pAVar1->False,a);
    a_01 = pAVar1->True;
    uVar5 = a;
  }
  else {
    if ((*(uint *)pAVar1 & 0x7fffffff) <= (*(uint *)pAVar2 & 0x7fffffff)) {
      local_40 = Abc_ZddDotMinProduct6(p,pAVar1->False,pAVar2->False);
      iVar4 = Abc_ZddMinUnion(p,pAVar2->False,pAVar2->True);
      iVar4 = Abc_ZddDotMinProduct6(p,pAVar1->True,iVar4);
      b_00 = Abc_ZddDotMinProduct6(p,pAVar1->False,pAVar2->True);
      iVar4 = Abc_ZddMinUnion(p,iVar4,b_00);
      goto LAB_0048fcb3;
    }
    local_40 = Abc_ZddDotMinProduct6(p,a_00,pAVar2->False);
    uVar5 = pAVar2->True;
    a_01 = a_00;
  }
  iVar4 = Abc_ZddDotMinProduct6(p,a_01,uVar5);
LAB_0048fcb3:
  iVar4 = Abc_ZddThresh(p,iVar4,5);
  iVar4 = Abc_ZddDiff(p,iVar4,local_40);
  uVar5 = *(uint *)pAVar2 & 0x7fffffff;
  if ((*(uint *)pAVar1 & 0x7fffffff) < (*(uint *)pAVar2 & 0x7fffffff)) {
    uVar5 = *(uint *)pAVar1 & 0x7fffffff;
  }
  iVar4 = Abc_ZddUniqueCreate(p,uVar5,iVar4,local_40);
  pAVar3 = p->pCache;
  uVar6 = uVar6 & p->nCacheMask;
  pAVar3[uVar6].Arg0 = a_00;
  pAVar3[uVar6].Arg1 = a;
  pAVar3[uVar6].Arg2 = 0xb;
  pAVar3[uVar6].Res = iVar4;
  p->nCacheMisses = p->nCacheMisses + 1;
  if (-1 < iVar4) {
    return iVar4;
  }
  __assert_fail("Res >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPerm.c"
                ,0x82,"int Abc_ZddCacheInsert(Abc_ZddMan *, int, int, int, int)");
}

Assistant:

int Abc_ZddDotMinProduct6( Abc_ZddMan * p, int a, int b )
{
    Abc_ZddObj * A, * B; 
    int r0, r1, b2, t1, t2, r;
    if ( a == 0 ) return 0;
    if ( b == 0 ) return 0;
    if ( a == 1 ) return b;
    if ( b == 1 ) return a;
    if ( a > b )  return Abc_ZddDotMinProduct6( p, b, a );
    if ( (r = Abc_ZddCacheLookup(p, a, b, ABC_ZDD_OPER_DOT_PROD_6)) >= 0 )
        return r;
    A = Abc_ZddNode( p, a );
    B = Abc_ZddNode( p, b );
    if ( A->Var < B->Var )
        r0 = Abc_ZddDotMinProduct6( p, A->False, b ), 
        r1 = Abc_ZddDotMinProduct6( p, A->True, b );
    else if ( A->Var > B->Var )
        r0 = Abc_ZddDotMinProduct6( p, a, B->False ), 
        r1 = Abc_ZddDotMinProduct6( p, a, B->True ); 
    else
        r0 = Abc_ZddDotMinProduct6( p, A->False, B->False ),
        b2 = Abc_ZddMinUnion( p, B->False, B->True ), 
        t1 = Abc_ZddDotMinProduct6( p, A->True, b2 ), 
        t2 = Abc_ZddDotMinProduct6( p, A->False, B->True ), 
        r1 = Abc_ZddMinUnion( p, t1, t2 );
    r1 = Abc_ZddThresh( p, r1, 5 ),
    r1 = Abc_ZddDiff( p, r1, r0 ); 
    r = Abc_ZddUniqueCreate( p, Abc_MinInt(A->Var, B->Var), r1, r0 );
    return Abc_ZddCacheInsert( p, a, b, ABC_ZDD_OPER_DOT_PROD_6, r );
}